

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_kernel clCreateKernel(cl_program program,char *kernel_name,cl_int *errcode_ret)

{
  CTracker *pCVar1;
  ulong enqueueCounter;
  CLIntercept *this;
  byte bVar2;
  cl_kernel kernel;
  time_point end;
  allocator local_71;
  time_point local_70;
  cl_program local_68;
  string local_60;
  cl_int localErrorCode;
  cl_kernel local_38;
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Dispatch).clCreateKernel == (cl_api_clCreateKernel)0x0)) {
    if (errcode_ret == (cl_int *)0x0) {
      return (cl_kernel)0x0;
    }
    *errcode_ret = -0x2c;
    return (cl_kernel)0x0;
  }
  enqueueCounter = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  bVar2 = (g_pIntercept->m_Config).CallLogging;
  if ((bool)bVar2 == true) {
    CLIntercept::callLoggingEnter
              (g_pIntercept,"clCreateKernel",enqueueCounter,(cl_kernel)0x0,
               "program = %p, kernel_name = %s",program,kernel_name);
    bVar2 = (this->m_Config).CallLogging;
  }
  localErrorCode = 0;
  if ((((bVar2 & 1) == 0) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_00111ff5:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_00111ff5;
  local_68 = program;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_70.__d.__r = (duration)0;
  }
  else {
    local_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  if ((this->m_Config).OverrideBuiltinKernels == true) {
    std::__cxx11::string::string((string *)&local_60,kernel_name,&local_71);
    kernel = CLIntercept::createBuiltinKernel(this,local_68,&local_60,errcode_ret);
    local_38 = kernel;
    std::__cxx11::string::~string((string *)&local_60);
    if (kernel == (cl_kernel)0x0) goto LAB_00112083;
  }
  else {
LAB_00112083:
    kernel = (*(this->m_Dispatch).clCreateKernel)(local_68,kernel_name,errcode_ret);
    local_38 = kernel;
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_60,"",&local_71);
      CLIntercept::updateHostTimingStats(this,"clCreateKernel",&local_60,local_70,end);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar2 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_00112172;
  }
  else {
    if (*errcode_ret == 0) goto LAB_00112172;
    CLIntercept::logError(this,"clCreateKernel",*errcode_ret);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_00112172:
  if ((kernel != (cl_kernel)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Kernels;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateKernel",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "returned %p",kernel);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_60,"",&local_71);
    CLIntercept::chromeCallLoggingExit(this,"clCreateKernel",&local_60,false,0,local_70,end);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (kernel == (cl_kernel)0x0) {
    return (cl_kernel)0x0;
  }
  std::__cxx11::string::string((string *)&local_60,kernel_name,&local_71);
  CLIntercept::addKernelInfo(this,kernel,local_68,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (((this->m_Config).KernelInfoLogging == false) &&
     ((this->m_Config).PreferredWorkGroupSizeMultipleLogging != true)) {
    return kernel;
  }
  CLIntercept::logKernelInfo(this,&local_38,1);
  return local_38;
}

Assistant:

CL_API_ENTRY cl_kernel CL_API_CALL CLIRN(clCreateKernel)(
    cl_program program,
    const char* kernel_name,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreateKernel )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "program = %p, kernel_name = %s",
            program,
            kernel_name );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_kernel   retVal = NULL;

        if( ( retVal == NULL ) &&
            pIntercept->config().OverrideBuiltinKernels )
        {
            retVal = pIntercept->createBuiltinKernel(
                program,
                kernel_name,
                errcode_ret );
        }

        if( retVal == NULL )
        {
            retVal = pIntercept->dispatch().clCreateKernel(
                program,
                kernel_name,
                errcode_ret );
        }

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        if( retVal != NULL )
        {
            pIntercept->addKernelInfo(
                retVal,
                program,
                kernel_name );
            if( pIntercept->config().KernelInfoLogging ||
                pIntercept->config().PreferredWorkGroupSizeMultipleLogging )
            {
                pIntercept->logKernelInfo(
                    &retVal,
                    1 );
            }
        }

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_PROGRAM);
}